

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined7 uVar10;
  char *pcVar8;
  GLFWwindow *handle;
  undefined8 uVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar11;
  char *pcVar12;
  GLint flags;
  GLint strategy;
  GLint mask;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  undefined4 local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  uint local_38;
  uint local_34;
  
  local_40 = 0;
  local_44 = 1;
  local_50 = 0;
  local_3c = 0;
  local_48 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  bVar2 = false;
switchD_00106ce6_caseD_64:
  bVar1 = bVar2;
  iVar3 = getopt(argc,argv,"a:b:dfhlm:n:p:s:");
  pcVar8 = optarg;
  uVar10 = (undefined7)
           ((ulong)((long)&switchD_00106ce6::switchdataD_00111004 +
                   (long)(int)(&switchD_00106ce6::switchdataD_00111004)[iVar3 - 0x61]) >> 8);
  bVar2 = true;
  switch(iVar3) {
  case 0x61:
    iVar3 = strcasecmp(optarg,"gl");
    local_5c = 0x30001;
    bVar2 = bVar1;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(pcVar8,"es");
      local_5c = 0x30002;
      break;
    }
    goto switchD_00106ce6_caseD_64;
  case 0x62:
    iVar3 = strcasecmp(optarg,"none");
    local_50 = 0x35002;
    bVar2 = bVar1;
    if (iVar3 == 0) goto switchD_00106ce6_caseD_64;
    iVar3 = strcasecmp(pcVar8,"flush");
    local_50 = 0x35001;
    break;
  case 99:
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x71:
  case 0x72:
    goto switchD_00106ce6_caseD_63;
  case 100:
    goto switchD_00106ce6_caseD_64;
  case 0x66:
    local_3c = (undefined4)CONCAT71(uVar10,1);
    bVar2 = bVar1;
    goto switchD_00106ce6_caseD_64;
  case 0x68:
    usage();
    goto LAB_00106f05;
  case 0x6c:
    local_48 = (undefined4)CONCAT71(uVar10,1);
    bVar2 = bVar1;
    goto switchD_00106ce6_caseD_64;
  case 0x6d:
    local_44 = atoi(optarg);
    bVar2 = bVar1;
    goto switchD_00106ce6_caseD_64;
  case 0x6e:
    local_40 = atoi(optarg);
    bVar2 = bVar1;
    goto switchD_00106ce6_caseD_64;
  case 0x70:
    iVar3 = strcasecmp(optarg,"core");
    local_58 = 0x32001;
    bVar2 = bVar1;
    if (iVar3 == 0) goto switchD_00106ce6_caseD_64;
    iVar3 = strcasecmp(pcVar8,"compat");
    local_58 = 0x32002;
    break;
  case 0x73:
    goto switchD_00106ce6_caseD_73;
  default:
    if (iVar3 == -1) {
      glfwGetVersion((int *)&local_4c,(int *)&local_34,(int *)&local_38);
      printf("GLFW header version: %u.%u.%u\n",3,1,1);
      printf("GLFW library version: %u.%u.%u\n",(ulong)local_4c,(ulong)local_34);
      uVar5 = local_4c;
      if (local_4c == 3) {
        if ((local_34 != 1) || (local_38 != 1)) {
          puts("*** WARNING: GLFW version mismatch! ***");
        }
        pcVar8 = glfwGetVersionString();
        printf("GLFW library version string: \"%s\"\n",pcVar8);
      }
      else {
        puts("*** ERROR: GLFW major version mismatch! ***");
      }
      if (uVar5 == 3) {
        glfwSetErrorCallback(error_callback);
        iVar4 = glfwInit();
        iVar3 = local_40;
        if (iVar4 != 0) {
          if (local_44 != 1 || local_40 != 0) {
            glfwWindowHint(0x22002,local_44);
            glfwWindowHint(0x22003,iVar3);
          }
          if (local_5c != 0) {
            glfwWindowHint(0x22001,local_5c);
          }
          if (bVar1) {
            glfwWindowHint(0x22007,1);
          }
          if ((char)local_3c != '\0') {
            glfwWindowHint(0x22006,1);
          }
          if (local_58 != 0) {
            glfwWindowHint(0x22008,local_58);
          }
          if (local_54 != 0) {
            glfwWindowHint(0x22005,local_54);
          }
          if (local_50 != 0) {
            glfwWindowHint(0x22009,local_50);
          }
          glfwWindowHint(0x21001,-1);
          glfwWindowHint(0x21002,-1);
          glfwWindowHint(0x21003,-1);
          glfwWindowHint(0x21004,-1);
          glfwWindowHint(0x21005,-1);
          glfwWindowHint(0x21006,-1);
          glfwWindowHint(0x21007,-1);
          glfwWindowHint(0x21008,-1);
          glfwWindowHint(0x21009,-1);
          glfwWindowHint(0x2100a,-1);
          glfwWindowHint(0x2100b,-1);
          glfwWindowHint(0x2100d,-1);
          glfwWindowHint(0x2100e,-1);
          glfwWindowHint(0x20004,0);
          handle = glfwCreateWindow(200,200,"Version",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
          if (handle != (GLFWwindow *)0x0) {
            glfwMakeContextCurrent(handle);
            iVar3 = glfwGetWindowAttrib(handle,0x22001);
            uVar5 = glfwGetWindowAttrib(handle,0x22002);
            uVar6 = glfwGetWindowAttrib(handle,0x22003);
            uVar7 = glfwGetWindowAttrib(handle,0x22004);
            pcVar8 = "Unknown API";
            if (iVar3 == 0x30002) {
              pcVar8 = "OpenGL ES";
            }
            pcVar12 = "OpenGL";
            if (iVar3 != 0x30001) {
              pcVar12 = pcVar8;
            }
            uVar9 = glGetString(0x1f02);
            printf("%s context version string: \"%s\"\n",pcVar12,uVar9);
            printf("%s context version parsed by GLFW: %u.%u.%u\n",pcVar12,(ulong)uVar5,(ulong)uVar6
                   ,(ulong)uVar7);
            if (iVar3 == 0x30001) {
              if (2 < (int)uVar5) {
                glGetIntegerv(0x821e,&local_4c);
                printf("%s context flags (0x%08x):","OpenGL",(ulong)local_4c);
                if ((local_4c & 1) != 0) {
                  printf(" forward-compatible");
                }
                if ((local_4c & 2) != 0) {
                  printf(" debug");
                }
                if ((local_4c & 4) != 0) {
                  printf(" robustness");
                }
                putchar(10);
                printf("%s context flags parsed by GLFW:","OpenGL");
                iVar4 = glfwGetWindowAttrib(handle,0x22006);
                if (iVar4 != 0) {
                  printf(" forward-compatible");
                }
                iVar4 = glfwGetWindowAttrib(handle,0x22007);
                if (iVar4 != 0) {
                  printf(" debug");
                }
                iVar4 = glfwGetWindowAttrib(handle,0x22005);
                if (iVar4 != 0) {
                  printf(" robustness");
                }
                putchar(10);
              }
              if ((3 < (int)uVar5) || (1 < (int)uVar6 && uVar5 == 3)) {
                iVar4 = glfwGetWindowAttrib(handle,0x22008);
                glGetIntegerv(0x9126,&local_34);
                pcVar11 = "unknown";
                pcVar8 = "core";
                if ((local_34 & 1) == 0) {
                  pcVar8 = "unknown";
                }
                if ((local_34 & 2) != 0) {
                  pcVar8 = "compat";
                }
                printf("%s profile mask (0x%08x): %s\n","OpenGL",(ulong)local_34,pcVar8);
                if (iVar4 == 0x32001) {
                  pcVar11 = "core";
                }
                if (iVar4 == 0x32002) {
                  pcVar11 = "compat";
                }
                printf("%s profile mask parsed by GLFW: %s\n","OpenGL",pcVar11);
              }
              iVar4 = glfwExtensionSupported("GL_ARB_robustness");
              if (iVar4 != 0) {
                glGetIntegerv(0x8256,&local_38);
                pcVar11 = "unknown";
                pcVar8 = "unknown";
                if (local_38 == 0x8261) {
                  pcVar8 = "none";
                }
                if (local_38 == 0x8252) {
                  pcVar8 = "lose";
                }
                printf("%s robustness strategy (0x%08x): %s\n","OpenGL",(ulong)local_38,pcVar8);
                iVar4 = glfwGetWindowAttrib(handle,0x22005);
                if (iVar4 == 0x31001) {
                  pcVar11 = "none";
                }
                if (iVar4 == 0x31002) {
                  pcVar11 = "lose";
                }
                printf("%s robustness strategy parsed by GLFW: %s\n","OpenGL",pcVar11);
              }
            }
            uVar9 = glGetString(0x1f01);
            printf("%s context renderer string: \"%s\"\n",pcVar12,uVar9);
            uVar9 = glGetString(0x1f00);
            printf("%s context vendor string: \"%s\"\n",pcVar12,uVar9);
            iVar4 = extraout_EDX;
            if (1 < (int)uVar5) {
              uVar9 = glGetString(0x8b8c);
              printf("%s context shading language version: \"%s\"\n",pcVar12,uVar9);
              iVar4 = extraout_EDX_00;
            }
            if ((char)local_48 != '\0') {
              list_extensions(iVar3,uVar5,iVar4);
            }
            glfwTerminate();
LAB_00106f05:
            exit(0);
          }
          glfwTerminate();
        }
      }
      goto LAB_00106ef6;
    }
    goto switchD_00106ce6_caseD_63;
  }
LAB_00106e4b:
  bVar2 = bVar1;
  if (iVar3 != 0) {
switchD_00106ce6_caseD_63:
    usage();
LAB_00106ef6:
    exit(1);
  }
  goto switchD_00106ce6_caseD_64;
switchD_00106ce6_caseD_73:
  iVar3 = strcasecmp(optarg,"none");
  local_54 = 0x31001;
  bVar2 = bVar1;
  if (iVar3 == 0) goto switchD_00106ce6_caseD_64;
  iVar3 = strcasecmp(pcVar8,"lose");
  local_54 = 0x31002;
  goto LAB_00106e4b;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, api = 0, profile = 0, strategy = 0, behavior = 0, major = 1, minor = 0, revision;
    GLboolean debug = GL_FALSE, forward = GL_FALSE, list = GL_FALSE;
    GLint flags, mask;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "a:b:dfhlm:n:p:s:")) != -1)
    {
        switch (ch)
        {
            case 'a':
                if (strcasecmp(optarg, API_OPENGL) == 0)
                    api = GLFW_OPENGL_API;
                else if (strcasecmp(optarg, API_OPENGL_ES) == 0)
                    api = GLFW_OPENGL_ES_API;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'b':
                if (strcasecmp(optarg, BEHAVIOR_NAME_NONE) == 0)
                    behavior = GLFW_RELEASE_BEHAVIOR_NONE;
                else if (strcasecmp(optarg, BEHAVIOR_NAME_FLUSH) == 0)
                    behavior = GLFW_RELEASE_BEHAVIOR_FLUSH;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'd':
                debug = GL_TRUE;
                break;
            case 'f':
                forward = GL_TRUE;
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 'l':
                list = GL_TRUE;
                break;
            case 'm':
                major = atoi(optarg);
                break;
            case 'n':
                minor = atoi(optarg);
                break;
            case 'p':
                if (strcasecmp(optarg, PROFILE_NAME_CORE) == 0)
                    profile = GLFW_OPENGL_CORE_PROFILE;
                else if (strcasecmp(optarg, PROFILE_NAME_COMPAT) == 0)
                    profile = GLFW_OPENGL_COMPAT_PROFILE;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 's':
                if (strcasecmp(optarg, STRATEGY_NAME_NONE) == 0)
                    strategy = GLFW_NO_RESET_NOTIFICATION;
                else if (strcasecmp(optarg, STRATEGY_NAME_LOSE) == 0)
                    strategy = GLFW_LOSE_CONTEXT_ON_RESET;
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    // Initialize GLFW and create window

    if (!valid_version())
        exit(EXIT_FAILURE);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (major != 1 || minor != 0)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, major);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, minor);
    }

    if (api != 0)
        glfwWindowHint(GLFW_CLIENT_API, api);

    if (debug)
        glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    if (forward)
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);

    if (profile != 0)
        glfwWindowHint(GLFW_OPENGL_PROFILE, profile);

    if (strategy)
        glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS, strategy);

    if (behavior)
        glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR, behavior);

    glfwWindowHint(GLFW_RED_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_GREEN_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_BLUE_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ALPHA_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_DEPTH_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_RED_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_AUX_BUFFERS, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_SAMPLES, GLFW_DONT_CARE);
    glfwWindowHint(GLFW_SRGB_CAPABLE, GLFW_DONT_CARE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(200, 200, "Version", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);

    // Report client API version

    api = glfwGetWindowAttrib(window, GLFW_CLIENT_API);
    major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
    minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
    revision = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);

    printf("%s context version string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_VERSION));

    printf("%s context version parsed by GLFW: %u.%u.%u\n",
           get_client_api_name(api),
           major, minor, revision);

    // Report client API context properties

    if (api == GLFW_OPENGL_API)
    {
        if (major >= 3)
        {
            glGetIntegerv(GL_CONTEXT_FLAGS, &flags);
            printf("%s context flags (0x%08x):", get_client_api_name(api), flags);

            if (flags & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT)
                printf(" forward-compatible");
            if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
                printf(" debug");
            if (flags & GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT_ARB)
                printf(" robustness");
            putchar('\n');

            printf("%s context flags parsed by GLFW:", get_client_api_name(api));

            if (glfwGetWindowAttrib(window, GLFW_OPENGL_FORWARD_COMPAT))
                printf(" forward-compatible");
            if (glfwGetWindowAttrib(window, GLFW_OPENGL_DEBUG_CONTEXT))
                printf(" debug");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS) != GLFW_NO_ROBUSTNESS)
                printf(" robustness");
            putchar('\n');
        }

        if (major > 3 || (major == 3 && minor >= 2))
        {
            int profile = glfwGetWindowAttrib(window, GLFW_OPENGL_PROFILE);

            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &mask);
            printf("%s profile mask (0x%08x): %s\n",
                   get_client_api_name(api),
                   mask,
                   get_profile_name_gl(mask));

            printf("%s profile mask parsed by GLFW: %s\n",
                   get_client_api_name(api),
                   get_profile_name_glfw(profile));
        }

        if (glfwExtensionSupported("GL_ARB_robustness"))
        {
            int robustness;
            GLint strategy;
            glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY_ARB, &strategy);

            printf("%s robustness strategy (0x%08x): %s\n",
                   get_client_api_name(api),
                   strategy,
                   get_strategy_name_gl(strategy));

            robustness = glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS);

            printf("%s robustness strategy parsed by GLFW: %s\n",
                   get_client_api_name(api),
                   get_strategy_name_glfw(robustness));
        }
    }

    printf("%s context renderer string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_RENDERER));
    printf("%s context vendor string: \"%s\"\n",
           get_client_api_name(api),
           glGetString(GL_VENDOR));

    if (major > 1)
    {
        printf("%s context shading language version: \"%s\"\n",
               get_client_api_name(api),
               glGetString(GL_SHADING_LANGUAGE_VERSION));
    }

    // Report client API extensions
    if (list)
        list_extensions(api, major, minor);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}